

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

double getVariance(Mat *inputImg,int y,int x)

{
  double dVar1;
  _InputArray *p_Var2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Scalar stddev;
  Scalar mean;
  Mat tempMat;
  _InputArray local_150;
  _OutputArray local_138;
  _OutputArray local_120;
  uint local_108;
  uint uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  Scalar_<double> local_f8;
  Scalar_<double> local_d8 [3];
  Mat local_78 [96];
  
  iVar5 = x - (uint)(0 < x);
  iVar6 = y - (uint)(0 < y);
  uVar3 = -(uint)((int)(x + 1U) < (int)((ulong)*(undefined8 *)(inputImg + 8) >> 0x20));
  uVar4 = -(uint)((int)(y + 1U) < (int)*(undefined8 *)(inputImg + 8));
  local_108 = ~uVar3 & x | x + 1U & uVar3;
  uStack_104 = ~uVar4 & y | y + 1U & uVar4;
  uStack_100 = 0;
  uStack_fc = 0;
  cv::Mat::Mat(local_78);
  local_150.obj = (void *)CONCAT44((uStack_104 - iVar6) + 1,(local_108 - iVar5) + 1);
  local_150.flags = iVar5;
  local_150._4_4_ = iVar6;
  cv::Mat::Mat((Mat *)local_d8,inputImg,(Rect_ *)&local_150);
  local_f8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_f8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x2010000;
  local_f8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)local_78;
  cv::Mat::copyTo((_OutputArray *)local_d8);
  cv::Mat::~Mat((Mat *)local_d8);
  cv::Scalar_<double>::Scalar_(local_d8);
  cv::Scalar_<double>::Scalar_(&local_f8);
  local_150.sz.width = 0;
  local_150.sz.height = 0;
  local_150.flags = 0x1010000;
  local_120.super__InputArray.flags = -0x3dfdfffa;
  local_120.super__InputArray.sz.width = 1;
  local_120.super__InputArray.sz.height = 4;
  local_138.super__InputArray.flags = -0x3dfdfffa;
  local_138.super__InputArray.sz.width = 1;
  local_138.super__InputArray.sz.height = 4;
  local_150.obj = local_78;
  local_138.super__InputArray.obj = &local_f8;
  local_120.super__InputArray.obj = local_d8;
  p_Var2 = (_InputArray *)cv::noArray();
  cv::meanStdDev(&local_150,&local_120,&local_138,p_Var2);
  dVar1 = (double)CONCAT44(local_f8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_,
                           local_f8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_);
  cv::Mat::~Mat(local_78);
  return dVar1 * dVar1;
}

Assistant:

double getVariance(Mat &inputImg, int y , int x) {
    int lowerBoundY = y -1 >=  0? y -1 : y;
    int upperBoundY = y + 1 < inputImg.rows? y + 1 : y;
    int lowerBoundX = x - 1 >= 0? x -1  :  x;
    int upperBoundX = x + 1 < inputImg.cols? x + 1 : x;
    Mat tempMat;
    int length = (upperBoundY - lowerBoundY) + 1;
    int width = (upperBoundX - lowerBoundX) + 1;
    inputImg(Rect(lowerBoundX, lowerBoundY, width, length)).copyTo(tempMat);
    Scalar mean, stddev;
    meanStdDev(tempMat, mean, stddev);
    return stddev.val[0] * stddev.val[0];
}